

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O3

int unpack_filename(char *file,char *dir,char *name,char *ver,int checkp)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = strrchr(file,0x2f);
  if (pcVar3 == (char *)0x0) {
    iVar2 = 0;
  }
  else {
    if (pcVar3 == file) {
      *dir = '/';
      dir = dir + 1;
    }
    else {
      do {
        cVar1 = *file;
        file = file + 1;
        *dir = cVar1;
        dir = dir + 1;
      } while (file != pcVar3);
    }
    *dir = '\0';
    strcpy(name,pcVar3 + 1);
    separate_version(name,ver,checkp);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int unpack_filename(char *file, char *dir, char *name, char *ver, int checkp)
{
  char *cp;

#ifdef DOS
  if ((cp = (char *)max((UNSIGNED)strrchr(file, DIRSEP), (UNSIGNED)strrchr(file, UNIXDIRSEP))) == 0)
    return (0);

  if (file[1] == DRIVESEP) { /* There's a drive spec; copy it and ignore it from here on. */
    *dir++ = *file++;
    *dir++ = *file++;
  }
#else  /* DOS */
  if ((cp = (char *)strrchr(file, UNIXDIRSEP)) == NULL) return (0);
#endif /* DOS */

  if (cp == file) {
    /* File is on a root directory. */
    *dir = '/';
    *(dir + 1) = '\0';
  } else {
    while (file != cp) *dir++ = *file++;
    *dir = '\0';
  }

  strcpy(name, cp + 1);
  separate_version(name, ver, checkp);
  return (1);
}